

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O0

qreal __thiscall QTextEdit::tabStopDistance(QTextEdit *this)

{
  long in_FS_OFFSET;
  qreal qVar1;
  QTextEditPrivate *d;
  QWidgetTextControl *in_stack_ffffffffffffffc0;
  QTextOption *this_00;
  QTextOption local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QTextEdit *)0x6d56f5);
  QWidgetTextControl::document(in_stack_ffffffffffffffc0);
  this_00 = local_20;
  QTextDocument::defaultTextOption();
  qVar1 = QTextOption::tabStopDistance(this_00);
  QTextOption::~QTextOption(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return qVar1;
  }
  __stack_chk_fail();
}

Assistant:

qreal QTextEdit::tabStopDistance() const
{
    Q_D(const QTextEdit);
    return d->control->document()->defaultTextOption().tabStopDistance();
}